

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderCollapseTriangle(ImVec2 p_min,bool is_open,float scale)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiContext *pIVar4;
  ImU32 col;
  ImGuiContext *g;
  undefined7 in_register_00000039;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  fVar7 = pIVar4->FontSize * 0.4 * scale;
  fVar8 = pIVar4->FontSize * 0.5;
  fVar9 = fVar8 + p_min.x;
  fVar8 = scale * fVar8 + p_min.y;
  if ((int)CONCAT71(in_register_00000039,is_open) == 0) {
    fVar10 = fVar7 * 0.0 + fVar8;
    fVar5 = fVar7 * -0.5 + fVar9;
    fVar6 = fVar8 + fVar7 * 0.866;
    fVar8 = fVar8 - fVar7 * 0.866;
    fVar11 = fVar5;
  }
  else {
    fVar8 = fVar7 * -0.25 + fVar8;
    fVar10 = fVar7 + fVar8;
    fVar5 = fVar9 - fVar7 * 0.866;
    fVar6 = fVar8 - fVar7 * 0.5;
    fVar11 = fVar7 * 0.866 + fVar9;
    fVar8 = fVar6;
    fVar7 = fVar7 * 0.0;
  }
  local_40.y = fVar10;
  local_40.x = fVar7 + fVar9;
  local_48.y = fVar6;
  local_48.x = fVar5;
  local_50.y = fVar8;
  local_50.x = fVar11;
  this = pIVar1->DrawList;
  local_38.x = (pIVar4->Style).Colors[0].x;
  local_38.y = (pIVar4->Style).Colors[0].y;
  uVar2 = (pIVar4->Style).Colors[0].z;
  uVar3 = (pIVar4->Style).Colors[0].w;
  local_38.w = (pIVar4->Style).Alpha * (float)uVar3;
  local_38.z = (float)uVar2;
  col = ColorConvertFloat4ToU32(&local_38);
  ImDrawList::AddTriangleFilled(this,&local_40,&local_48,&local_50,col);
  return;
}

Assistant:

void ImGui::RenderCollapseTriangle(ImVec2 p_min, bool is_open, float scale)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    const float h = g.FontSize * 1.00f;
    const float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h*0.50f, h*0.50f*scale);

    ImVec2 a, b, c;
    if (is_open)
    {
        center.y -= r*0.25f;
        a = center + ImVec2(0,1)*r;
        b = center + ImVec2(-0.866f,-0.5f)*r;
        c = center + ImVec2(0.866f,-0.5f)*r;
    }
    else
    {
        a = center + ImVec2(1,0)*r;
        b = center + ImVec2(-0.500f,0.866f)*r;
        c = center + ImVec2(-0.500f,-0.866f)*r;
    }

    window->DrawList->AddTriangleFilled(a, b, c, GetColorU32(ImGuiCol_Text));
}